

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

Flow * __thiscall
wasm::ExpressionRunner<wasm::PrecomputingExpressionRunner>::visitStructGet
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::PrecomputingExpressionRunner> *this,
          StructGet *curr)

{
  bool bVar1;
  PrecomputingExpressionRunner *this_00;
  Struct *this_01;
  const_reference pvVar2;
  element_type *peVar3;
  Literal *other;
  Literal local_d0;
  Literal local_b8;
  HeapType local_a0;
  undefined1 auStack_98 [8];
  value_type field;
  shared_ptr<wasm::GCData> data;
  undefined1 local_68 [8];
  Flow ref;
  StructGet *curr_local;
  ExpressionRunner<wasm::PrecomputingExpressionRunner> *this_local;
  
  ref.breakTo.super_IString.str._M_str = (char *)curr;
  this_00 = self(this);
  visit((Flow *)local_68,(ExpressionRunner<wasm::PrecomputingExpressionRunner> *)this_00,
        *(Expression **)(ref.breakTo.super_IString.str._M_str + 0x18));
  bVar1 = Flow::breaking((Flow *)local_68);
  if (bVar1) {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_68);
  }
  else {
    Flow::getSingleValue((Flow *)local_68);
    wasm::Literal::getGCData((Literal *)&field.packedType);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&field.packedType);
    if (!bVar1) {
      (*this->_vptr_ExpressionRunner[2])(this,"null ref");
    }
    local_a0 = wasm::Type::getHeapType
                         ((Type *)(*(long *)(ref.breakTo.super_IString.str._M_str + 0x18) + 8));
    this_01 = HeapType::getStruct(&local_a0);
    pvVar2 = std::vector<wasm::Field,_std::allocator<wasm::Field>_>::operator[]
                       (&this_01->fields,
                        (ulong)*(uint *)(ref.breakTo.super_IString.str._M_str + 0x10));
    auStack_98 = (undefined1  [8])(pvVar2->type).id;
    field.type.id._0_4_ = pvVar2->packedType;
    field.type.id._4_4_ = pvVar2->mutable_;
    peVar3 = std::__shared_ptr_access<wasm::GCData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<wasm::GCData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&field.packedType);
    other = SmallVector<wasm::Literal,_1UL>::operator[]
                      (&(peVar3->values).super_SmallVector<wasm::Literal,_1UL>,
                       (ulong)*(uint *)(ref.breakTo.super_IString.str._M_str + 0x10));
    wasm::Literal::Literal(&local_d0,other);
    extendForPacking(&local_b8,this,&local_d0,(Field *)auStack_98,
                     (bool)(ref.breakTo.super_IString.str._M_str[0x20] & 1));
    Flow::Flow(__return_storage_ptr__,&local_b8);
    wasm::Literal::~Literal(&local_b8);
    wasm::Literal::~Literal(&local_d0);
    std::shared_ptr<wasm::GCData>::~shared_ptr((shared_ptr<wasm::GCData> *)&field.packedType);
  }
  Flow::~Flow((Flow *)local_68);
  return __return_storage_ptr__;
}

Assistant:

Flow visitStructGet(StructGet* curr) {
    NOTE_ENTER("StructGet");
    Flow ref = self()->visit(curr->ref);
    if (ref.breaking()) {
      return ref;
    }
    auto data = ref.getSingleValue().getGCData();
    if (!data) {
      trap("null ref");
    }
    auto field = curr->ref->type.getHeapType().getStruct().fields[curr->index];
    return extendForPacking(data->values[curr->index], field, curr->signed_);
  }